

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

char * parse_identifier(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_t token_02;
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  char *identifier;
  gtoken_s token;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  char *local_30;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  token_02 = gravity_lexer_peek(lexer_00);
  if (token_02 == TOK_IDENTIFIER) {
    gravity_lexer_next(lexer_00);
    gravity_lexer_token((gtoken_s *)&identifier,lexer_00);
    token_01.colno = token.type;
    token_01._0_8_ = identifier;
    token_01.position = token.lineno;
    token_01.bytes = token.colno;
    token_01.length = token.position;
    token_01.fileid = token.bytes;
    token_01.builtin = token.length;
    token_01.value = (char *)token._24_8_;
    parser_local = (gravity_parser_t *)cstring_from_token(parser,token_01);
  }
  else {
    if (token_02 == TOK_ERROR) {
      parse_error(parser);
    }
    else {
      gravity_lexer_token((gtoken_s *)&token.value,lexer_00);
      pcVar1 = token_name(token_02);
      token_00.lineno = token.value._4_4_;
      token_00.type = token.value._0_4_;
      token_00.colno = uStack_48;
      token_00.position = uStack_44;
      token_00.bytes = local_40;
      token_00.length = uStack_3c;
      token_00.fileid = uStack_38;
      token_00.builtin = uStack_34;
      token_00.value = local_30;
      report_error(parser,GRAVITY_ERROR_SYNTAX,token_00,"Expected identifier but found %s",pcVar1,
                   in_R8,in_R9);
    }
    parser_local = (gravity_parser_t *)0x0;
  }
  return (char *)parser_local;
}

Assistant:

static const char *parse_identifier (gravity_parser_t *parser) {
    DECLARE_LEXER;

    // parse IDENTIFIER is always mandatory
    gtoken_t type = gravity_lexer_peek(lexer);
    if (type != TOK_IDENTIFIER) {
        if (type == TOK_ERROR) parse_error(parser);
        else REPORT_ERROR(gravity_lexer_token(lexer), "Expected identifier but found %s", token_name(type));
        return NULL;
    }

    gravity_lexer_next(lexer);
    gtoken_s token = gravity_lexer_token(lexer);
    const char *identifier = cstring_from_token(parser, token);
    return identifier;
}